

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void * LoadSDL20Symbol(char *fn,int *okay)

{
  char cVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  
  if (*okay != 0) {
    pvVar3 = (void *)dlsym(Loaded_SDL20,fn);
    if (pvVar3 == (void *)0x0) {
      lVar2 = 0;
      do {
        lVar4 = lVar2;
        cVar1 = fn[lVar4];
        loaderror[lVar4] = cVar1;
        lVar2 = lVar4 + 1;
      } while (cVar1 != '\0');
      builtin_strncpy(loaderror + lVar4 + 10,"n SDL2 l",8);
      builtin_strncpy(loaderror + lVar4 + 0x12,"ibrary.",8);
      builtin_strncpy(loaderror + lVar4," missing",8);
      builtin_strncpy(loaderror + lVar4 + 8," in SDL2",8);
      *okay = 0;
      pvVar3 = (void *)0x0;
    }
    return pvVar3;
  }
  return (void *)0x0;
}

Assistant:

static void *
LoadSDL20Symbol(const char *fn, int *okay)
{
    void *retval = NULL;
    if (*okay) { /* only bother trying if we haven't previously failed. */
        retval = LookupSDL20Sym(fn);
        if (retval == NULL) {
            char *p = SDL12COMPAT_stpcpy(loaderror, fn);
            SDL12COMPAT_stpcpy(p, " missing in SDL2 library.");
            *okay = 0;
        }
    }
    return retval;
}